

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SysInfo.cpp
# Opt level: O3

void __thiscall AutoSystemInfo::Initialize(AutoSystemInfo *this)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  code *pcVar5;
  bool bVar6;
  DWORD DVar7;
  undefined4 *puVar8;
  HANDLE pVVar9;
  char *this_00;
  WCHAR local_228 [4];
  WCHAR DisableDebugScopeCaptureFlag [260];
  
  if (this->initialized == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/SysInfo.cpp"
                       ,0x42,"(!initialized)","!initialized");
    if (!bVar6) goto LAB_00367b30;
    *puVar8 = 0;
  }
  PAL_InitializeChakraCore();
  this->majorVersion = 1;
  this->minorVersion = 0xd;
  pVVar9 = GetCurrentProcess();
  this->processHandle = pVVar9;
  this_00 = (char *)this;
  GetSystemInfo(&this->super_SYSTEM_INFO);
  if ((this->super_SYSTEM_INFO).dwPageSize != 0x1000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    this_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/SysInfo.cpp"
    ;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/SysInfo.cpp"
                       ,0x4d,"(this->dwPageSize == AutoSystemInfo::PageSize)",
                       "this->dwPageSize == AutoSystemInfo::PageSize");
    if (!bVar6) {
LAB_00367b30:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
  }
  piVar1 = (int *)cpuid_basic_info(0);
  if (*piVar1 != 0) {
    piVar1 = (int *)cpuid_Version_info(1);
    iVar2 = piVar1[1];
    iVar3 = piVar1[2];
    iVar4 = piVar1[3];
    this->CPUInfo[0] = *piVar1;
    this->CPUInfo[1] = iVar2;
    this->CPUInfo[2] = iVar4;
    this->CPUInfo[3] = iVar3;
  }
  bVar6 = CheckForAtom((AutoSystemInfo *)this_00);
  this->isAtom = bVar6;
  this->allocationGranularityPageCount =
       (this->super_SYSTEM_INFO).dwAllocationGranularity / (this->super_SYSTEM_INFO).dwPageSize;
  this->isWindows8OrGreater = false;
  this->isWindows8Point1OrGreater = false;
  this->binaryName[0] = L'\0';
  InitPhysicalProcessorCount(this);
  this->initialized = true;
  DVar7 = GetEnvironmentVariableW(L"JS_DEBUG_SCOPE",local_228,0x104);
  this->disableDebugScopeCapture = DVar7 != 0;
  this->availableCommit = 0;
  *(undefined4 *)((long)&this->availableCommit + 7) = 0;
  ChakraBinaryAutoSystemInfoInit(this);
  return;
}

Assistant:

void
AutoSystemInfo::Initialize()
{
    Assert(!initialized);
#ifndef _WIN32
    PAL_InitializeChakraCore();
    majorVersion = CHAKRA_CORE_MAJOR_VERSION;
    minorVersion = CHAKRA_CORE_MINOR_VERSION;
#endif

    processHandle = GetCurrentProcess();
    GetSystemInfo(this);

    // Make the page size constant so calculation are faster.
    Assert(this->dwPageSize == AutoSystemInfo::PageSize);
#if defined(_M_IX86) || defined(_M_X64)
    get_cpuid(CPUInfo, 1);
    isAtom = CheckForAtom();
#endif
#if defined(_M_ARM32_OR_ARM64)
    armDivAvailable = IsProcessorFeaturePresent(PF_ARM_DIVIDE_INSTRUCTION_AVAILABLE) ? true : false;
#endif
    allocationGranularityPageCount = dwAllocationGranularity / dwPageSize;

    isWindows8OrGreater = IsWindows8OrGreater();
    isWindows8Point1OrGreater = IsWindows8Point1OrGreater();

    binaryName[0] = _u('\0');

#if SYSINFO_IMAGE_BASE_AVAILABLE
    dllLoadAddress = (UINT_PTR)&__ImageBase;
    dllHighAddress = (UINT_PTR)&__ImageBase +
        ((PIMAGE_NT_HEADERS)(((char *)&__ImageBase) + __ImageBase.e_lfanew))->OptionalHeader.SizeOfImage;
#endif

    InitPhysicalProcessorCount();
#if DBG
    initialized = true;
#endif

    WCHAR DisableDebugScopeCaptureFlag[MAX_PATH];
    if (::GetEnvironmentVariable(_u("JS_DEBUG_SCOPE"), DisableDebugScopeCaptureFlag, _countof(DisableDebugScopeCaptureFlag)) != 0)
    {
        disableDebugScopeCapture = true;
    }
    else
    {
        disableDebugScopeCapture = false;
    }

    this->supportsOnlyMultiThreadedCOM = false;
#if defined(__ANDROID__) || defined(__IOS__)
    this->isLowMemoryDevice = true;
    this->shouldQCMoreFrequently = true;
#else
    this->shouldQCMoreFrequently = false;
    this->isLowMemoryDevice = false;
#endif

    // 0 indicates we haven't retrieved the available commit. We get it lazily.
    this->availableCommit = 0;

    ChakraBinaryAutoSystemInfoInit(this);
}